

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# msd_dyn_vector.cpp
# Opt level: O3

void msd_D<std::deque<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
               (uchar **strings,size_t n,size_t depth,
               deque<unsigned_char_*,_std::allocator<unsigned_char_*>_> *buckets)

{
  deque<unsigned_char*,std::allocator<unsigned_char*>> *pdVar1;
  _Map_pointer pppuVar2;
  ushort uVar3;
  uchar *puVar4;
  uchar *puVar5;
  undefined8 *puVar6;
  long *plVar7;
  int iVar8;
  uint j;
  long lVar9;
  _Map_pointer *ppppuVar10;
  uchar **ppuVar11;
  ulong uVar12;
  ulong uVar13;
  byte bVar14;
  byte bVar15;
  uint j_1;
  long lVar16;
  uint i;
  uchar **ppuVar17;
  _Elt_pointer *pppuVar18;
  undefined1 auVar19 [16];
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  undefined4 uVar23;
  long lVar24;
  array<unsigned_short,_256UL> bucketsize;
  _Deque_iterator<unsigned_char_*,_unsigned_char_*const_&,_unsigned_char_*const_*> local_278;
  _Deque_iterator<unsigned_char_*,_unsigned_char_*const_&,_unsigned_char_*const_*> local_258;
  ushort local_238 [260];
  
  if (n < 0x20) {
    if (1 < n) {
      ppuVar11 = strings;
      do {
        puVar4 = ppuVar11[1];
        ppuVar11 = ppuVar11 + 1;
        for (ppuVar17 = ppuVar11; strings < ppuVar17; ppuVar17 = ppuVar17 + -1) {
          puVar5 = ppuVar17[-1];
          bVar14 = puVar5[depth];
          bVar15 = puVar4[depth];
          if ((bVar14 != 0) && (lVar9 = depth + 1, bVar14 == bVar15)) {
            do {
              bVar14 = puVar5[lVar9];
              bVar15 = puVar4[lVar9];
              if (bVar14 == 0) break;
              lVar9 = lVar9 + 1;
            } while (bVar14 == bVar15);
          }
          if (bVar14 <= bVar15) break;
          *ppuVar17 = puVar5;
        }
        iVar8 = (int)n;
        *ppuVar17 = puVar4;
        n = (size_t)(iVar8 - 1);
      } while (2 < iVar8);
    }
  }
  else {
    if ((n & 0xffffffffffffffe0) == 0) {
      uVar13 = 0;
    }
    else {
      uVar13 = 0;
      ppuVar11 = strings;
      do {
        lVar9 = 0;
        do {
          *(uchar *)((long)local_238 + lVar9) = ppuVar11[lVar9][depth];
          lVar9 = lVar9 + 1;
        } while (lVar9 != 0x20);
        lVar9 = 0;
        ppuVar17 = ppuVar11;
        do {
          uVar12 = (ulong)((uint)*(byte *)((long)local_238 + lVar9) * 0x50);
          pdVar1 = (deque<unsigned_char*,std::allocator<unsigned_char*>> *)
                   ((long)&(buckets->
                           super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                           _M_impl.super__Deque_impl_data._M_map + uVar12);
          puVar6 = *(undefined8 **)
                    ((long)&(buckets->
                            super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                            _M_impl.super__Deque_impl_data._M_finish._M_cur + uVar12);
          if (puVar6 == (undefined8 *)
                        (*(long *)((long)&(buckets->
                                          super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                          )._M_impl.super__Deque_impl_data._M_finish._M_last +
                                  uVar12) + -8)) {
            std::deque<unsigned_char*,std::allocator<unsigned_char*>>::
            _M_push_back_aux<unsigned_char*const&>(pdVar1,ppuVar17);
          }
          else {
            *puVar6 = *ppuVar17;
            pdVar1 = pdVar1 + 0x30;
            *(long *)pdVar1 = *(long *)pdVar1 + 8;
          }
          lVar9 = lVar9 + 1;
          ppuVar17 = ppuVar17 + 1;
        } while (lVar9 != 0x20);
        uVar13 = uVar13 + 0x20;
        ppuVar11 = ppuVar11 + 0x20;
      } while (uVar13 < (n & 0xffffffffffffffe0));
    }
    lVar9 = n - uVar13;
    if (uVar13 <= n && lVar9 != 0) {
      ppuVar11 = strings + uVar13;
      do {
        uVar13 = (ulong)((uint)(*ppuVar11)[depth] * 0x50);
        pdVar1 = (deque<unsigned_char*,std::allocator<unsigned_char*>> *)
                 ((long)&(buckets->
                         super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                         _M_impl.super__Deque_impl_data._M_map + uVar13);
        plVar7 = *(long **)((long)&(buckets->
                                   super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                   )._M_impl.super__Deque_impl_data._M_finish._M_cur + uVar13);
        if (plVar7 == (long *)(*(long *)((long)&(buckets->
                                                super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>
                                                )._M_impl.super__Deque_impl_data._M_finish._M_last +
                                        uVar13) + -8)) {
          std::deque<unsigned_char*,std::allocator<unsigned_char*>>::
          _M_push_back_aux<unsigned_char*const&>(pdVar1,ppuVar11);
        }
        else {
          *plVar7 = (long)*ppuVar11;
          pdVar1 = pdVar1 + 0x30;
          *(long *)pdVar1 = *(long *)pdVar1 + 8;
        }
        ppuVar11 = ppuVar11 + 1;
        lVar9 = lVar9 + -1;
      } while (lVar9 != 0);
    }
    ppppuVar10 = &buckets[1].super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>.
                  _M_impl.super__Deque_impl_data._M_finish._M_node;
    lVar9 = 0;
    do {
      pppuVar2 = *ppppuVar10;
      lVar16 = (long)ppppuVar10[-10];
      auVar22._0_4_ = -(uint)((int)lVar16 == 0);
      auVar22._4_4_ = -(uint)((int)((ulong)lVar16 >> 0x20) == 0);
      auVar22._8_4_ = -(uint)((int)pppuVar2 == 0);
      auVar22._12_4_ = -(uint)((int)((ulong)pppuVar2 >> 0x20) == 0);
      auVar19._4_4_ = auVar22._0_4_;
      auVar19._0_4_ = auVar22._4_4_;
      auVar19._8_4_ = auVar22._12_4_;
      auVar19._12_4_ = auVar22._8_4_;
      auVar20._8_4_ = 0xffffffff;
      auVar20._0_8_ = 0xffffffffffffffff;
      auVar20._12_4_ = 0xffffffff;
      auVar20 = auVar19 & auVar22 ^ auVar20;
      lVar24 = ((ulong)((long)ppppuVar10[-5] - (long)ppppuVar10[-7]) >> 3) +
               ((ulong)((long)((iterator *)(ppppuVar10 + -3))->_M_cur - (long)ppppuVar10[-2]) >> 3)
               + (auVar20._8_8_ + ((ulong)((long)pppuVar2 - (long)ppppuVar10[-4]) >> 3)) * 0x40;
      uVar23 = (undefined4)lVar24;
      auVar21._4_4_ = uVar23;
      auVar21._0_4_ =
           (int)(((ulong)((long)ppppuVar10[-0xf] - (long)ppppuVar10[-0x11]) >> 3) +
                 ((ulong)((long)ppppuVar10[-0xd] - (long)ppppuVar10[-0xc]) >> 3) +
                (auVar20._0_8_ + ((ulong)(lVar16 - (long)ppppuVar10[-0xe]) >> 3)) * 0x40);
      auVar21._8_4_ = uVar23;
      auVar21._12_4_ = (int)((ulong)lVar24 >> 0x20);
      auVar20 = pshuflw(auVar21,auVar21,0xe8);
      *(int *)(local_238 + lVar9) = auVar20._0_4_;
      lVar9 = lVar9 + 2;
      ppppuVar10 = ppppuVar10 + 0x14;
    } while (lVar9 != 0x100);
    pppuVar18 = &(buckets->super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                 _M_impl.super__Deque_impl_data._M_finish._M_last;
    lVar9 = 0;
    lVar16 = 0;
    do {
      uVar3 = local_238[lVar9];
      if ((ulong)uVar3 != 0) {
        local_258._M_cur = pppuVar18[-6];
        local_258._M_first = pppuVar18[-5];
        local_258._M_last = pppuVar18[-4];
        local_258._M_node = (_Map_pointer)pppuVar18[-3];
        local_278._M_cur = ((iterator *)(pppuVar18 + -2))->_M_cur;
        local_278._M_first = pppuVar18[-1];
        local_278._M_last = *pppuVar18;
        local_278._M_node = (_Map_pointer)pppuVar18[1];
        std::
        __copy_move_dit<false,unsigned_char*,unsigned_char*const&,unsigned_char*const*,unsigned_char**>
                  (&local_258,&local_278,strings + lVar16);
        lVar16 = lVar16 + (ulong)uVar3;
      }
      lVar9 = lVar9 + 1;
      pppuVar18 = pppuVar18 + 10;
    } while (lVar9 != 0x100);
    lVar9 = 0;
    do {
      std::deque<unsigned_char_*,_std::allocator<unsigned_char_*>_>::clear
                ((deque<unsigned_char_*,_std::allocator<unsigned_char_*>_> *)
                 ((long)&(buckets->
                         super__Deque_base<unsigned_char_*,_std::allocator<unsigned_char_*>_>).
                         _M_impl.super__Deque_impl_data._M_map + lVar9));
      lVar9 = lVar9 + 0x50;
    } while (lVar9 != 0x5000);
    uVar13 = (ulong)local_238[0];
    lVar9 = 1;
    do {
      uVar12 = (ulong)local_238[lVar9];
      if (uVar12 != 0) {
        msd_D<std::deque<unsigned_char*,std::allocator<unsigned_char*>>,unsigned_short>
                  (strings + uVar13,uVar12,depth + 1,buckets);
        uVar13 = uVar13 + uVar12;
      }
      lVar9 = lVar9 + 1;
    } while (lVar9 != 0x100);
  }
  return;
}

Assistant:

static void
msd_D(unsigned char** strings, size_t n, size_t depth, Bucket* buckets)
{
	if (n < 32) {
		insertion_sort(strings, n, depth);
		return;
	}
	// Use a small cache to reduce memory stalls.
	size_t i=0;
	for (; i < n-n%32; i+=32) {
		unsigned char cache[32];
		for (unsigned j=0; j < 32; ++j) {
			cache[j] = strings[i+j][depth];
		}
		for (unsigned j=0; j < 32; ++j) {
			buckets[cache[j]].push_back(strings[i+j]);
		}
	}
	for (; i < n; ++i) {
		buckets[strings[i][depth]].push_back(strings[i]);
	}
	std::array<BucketsizeType, 256> bucketsize;
	for (unsigned i=0; i < 256; ++i) {
		bucketsize[i] = buckets[i].size();
	}
	size_t pos = 0;
	for (unsigned i=0; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		copy(buckets[i], strings+pos);
		pos += bucketsize[i];
	}
	for (unsigned i=0; i < 256; ++i) {
		buckets[i].clear();
	}
	pos = bucketsize[0];
	for (unsigned i=1; i < 256; ++i) {
		if (bucketsize[i] == 0) continue;
		msd_D<Bucket, BucketsizeType>(strings+pos, bucketsize[i], depth+1, buckets);
		pos += bucketsize[i];
	}
}